

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.h
# Opt level: O2

bool __thiscall
Refal2::COperationsExecuter::matchLeftDuplicateSaveToTable_WV
          (COperationsExecuter *this,TTableIndex origin)

{
  CUnitNode *pCVar1;
  long lVar2;
  CUnitNode *unit;
  CUnitNode *pCVar3;
  bool bVar4;
  CNode<Refal2::CUnit> **ppCVar5;
  
  pCVar1 = this->left;
  ppCVar5 = this->table + origin;
  lVar2 = (long)ppCVar5[1];
  do {
    unit = *ppCVar5;
    pCVar3 = *(CUnitNode **)(lVar2 + 0x18);
    if (unit == pCVar3) {
      saveToTable(this,pCVar1->next,this->left);
      break;
    }
    bVar4 = shiftLeft(this);
    if (!bVar4) break;
    bVar4 = CUnit::IsEqualWith(&this->left->super_CUnit,&unit->super_CUnit);
    ppCVar5 = &unit->next;
  } while (bVar4);
  return unit == pCVar3;
}

Assistant:

inline bool COperationsExecuter::matchLeftDuplicateSaveToTable_WV(
	const TTableIndex origin )
{
	CUnitNode* originLeft = table[origin];
	CUnitNode* const originRight = table[origin + 1];
	CUnitNode* valueBegin = left;
	for( ; originLeft != originRight->Next();
		originLeft = originLeft->Next() )
	{
		if( !shiftLeft() || !left->IsEqualWith( *originLeft ) ) {
			return false;
		}
	}
	saveToTable( valueBegin->Next(), left );
	return true;
}